

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O3

ParamGenerator<(anonymous_namespace)::CcsTestCase>
testing::
ValuesIn<std::vector<(anonymous_namespace)::CcsTestCase,std::allocator<(anonymous_namespace)::CcsTestCase>>>
          (vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
           *container)

{
  long lVar1;
  long lVar2;
  pointer pCVar3;
  pointer pCVar4;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar5;
  size_t in_RSI;
  size_t __n;
  _Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
  *this;
  ParamGenerator<(anonymous_namespace)::CcsTestCase> PVar6;
  
  __n = in_RSI;
  pCVar3 = (pointer)operator_new(0x20);
  (pCVar3->name)._M_dataplus._M_p = (pointer)&PTR__ValuesInIteratorRangeGenerator_001a6c58;
  (pCVar3->name)._M_string_length = 0;
  (pCVar3->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pCVar3->name).field_2 + 8) = 0;
  this = (_Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
          *)(((long)(in_RDX - in_RSI) >> 3) * 0x2e8ba2e8ba2e8ba3);
  if ((_Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
       *)0x1745d1745d1745d < this) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  pCVar4 = std::
           _Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
           ::_M_allocate(this,__n);
  (pCVar3->name)._M_string_length = (size_type)pCVar4;
  *(size_t *)((long)&(pCVar3->name).field_2 + 8) = (in_RDX - in_RSI) + (long)pCVar4;
  if (in_RSI != in_RDX) {
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      *(char **)((long)&(pCVar4->name)._M_dataplus._M_p + lVar5) =
           (pCVar4->name).field_2._M_local_buf + lVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&(pCVar4->name)._M_dataplus._M_p + lVar5),
                 *(long *)(in_RSI + lVar5),*(long *)(in_RSI + 8 + lVar5) + *(long *)(in_RSI + lVar5)
                );
      lVar1 = lVar5 + in_RSI;
      *(char **)((long)&(pCVar4->ccs)._M_dataplus._M_p + lVar5) =
           (pCVar4->ccs).field_2._M_local_buf + lVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&(pCVar4->ccs)._M_dataplus._M_p + lVar5),*(long *)(lVar1 + 0x20),
                 *(long *)(lVar1 + 0x28) + *(long *)(lVar1 + 0x20));
      std::
      vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>::
      vector((vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>
              *)((long)&(pCVar4->assertions).
                        super__Vector_base<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5),
             (vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>
              *)(lVar1 + 0x40));
      lVar2 = lVar5 + 0x58;
    } while (lVar1 + 0x58U != in_RDX);
    pCVar4 = (pointer)((long)&pCVar4[1].name._M_dataplus._M_p + lVar5);
  }
  (pCVar3->name).field_2._M_allocated_capacity = (size_type)pCVar4;
  (container->
  super__Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
  )._M_impl.super__Vector_impl_data._M_start = pCVar3;
  (container->
  super__Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar6.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pointer)operator_new(0x18);
  ((PVar6.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->name)._M_string_length = 0x100000001;
  ((PVar6.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->name)._M_dataplus._M_p = (pointer)&PTR___Sp_counted_base_001a6d20;
  ((PVar6.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->name).field_2._M_allocated_capacity = (size_type)pCVar3;
  (container->
  super__Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       PVar6.impl_.
       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  PVar6.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  return (ParamGenerator<(anonymous_namespace)::CcsTestCase>)
         PVar6.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<typename Container::value_type> ValuesIn(
    const Container& container) {
  return ValuesIn(container.begin(), container.end());
}